

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::assertionPassed(RunContext *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x1e9) = 1;
  *(long *)(in_RDI + 0xf8) = *(long *)(in_RDI + 0xf8) + 1;
  resetAssertionInfo(this);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x12f732);
  return;
}

Assistant:

void RunContext::assertionPassed() {
        m_lastAssertionPassed = true;
        ++m_totals.assertions.passed;
        resetAssertionInfo();
        m_messageScopes.clear();
    }